

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu.cpp
# Opt level: O0

int __thiscall ncnn::SELU::forward_inplace(SELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  long in_RSI;
  long in_RDI;
  double dVar7;
  int i;
  float *ptr;
  int q;
  float alphaxlambda;
  int size;
  int channels;
  int h;
  int w;
  int local_90;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int local_30;
  
  iVar3 = *(int *)(in_RSI + 0x2c);
  iVar4 = *(int *)(in_RSI + 0x30);
  iVar5 = *(int *)(in_RSI + 0x38);
  fVar1 = *(float *)(in_RDI + 0xd0);
  fVar2 = *(float *)(in_RDI + 0xd4);
  for (local_30 = 0; local_30 < iVar5; local_30 = local_30 + 1) {
    ncnn::Mat::channel(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    pfVar6 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffff80);
    ncnn::Mat::~Mat((Mat *)0x8e3f2b);
    for (local_90 = 0; local_90 < iVar3 * iVar4; local_90 = local_90 + 1) {
      if (0.0 < pfVar6[local_90] || pfVar6[local_90] == 0.0) {
        pfVar6[local_90] = *(float *)(in_RDI + 0xd4) * pfVar6[local_90];
      }
      else {
        dVar7 = std::exp((double)(ulong)(uint)pfVar6[local_90]);
        pfVar6[local_90] = (SUB84(dVar7,0) - 1.0) * fVar1 * fVar2;
      }
    }
  }
  return 0;
}

Assistant:

int SELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    float alphaxlambda = alpha * lambda;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = static_cast<float>((exp(ptr[i]) - 1.f) * alphaxlambda);
            else
                ptr[i] *= lambda;
        }
    }

    return 0;
}